

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yyparse_from(GREG *G,yyrule yystart)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  yythunk *pyVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  int pos;
  long lVar10;
  
  if (G->buflen == 0) {
    G->buflen = 0x400;
    pcVar5 = (char *)malloc(0x400);
    G->buf = pcVar5;
    G->textlen = 0x400;
    pcVar5 = (char *)malloc(0x400);
    G->text = pcVar5;
    G->thunkslen = 0x80;
    pyVar6 = (yythunk *)malloc(0x1000);
    G->thunks = pyVar6;
    G->valslen = 0x80;
    piVar7 = (int *)malloc(0x200);
    G->vals = piVar7;
    G->limit = 0;
  }
  else {
    piVar7 = G->vals;
  }
  G->pos = 0;
  G->begin = 0;
  G->end = 0;
  G->thunkpos = 0;
  G->val = piVar7;
  iVar3 = (*yystart)(G);
  if (iVar3 != 0) {
    lVar9 = 0;
    for (lVar10 = 0; lVar10 < G->thunkpos; lVar10 = lVar10 + 1) {
      pyVar6 = G->thunks;
      iVar4 = *(int *)((long)&pyVar6->begin + lVar9);
      iVar8 = *(int *)((long)&pyVar6->end + lVar9);
      if (iVar8 != 0) {
        iVar4 = yyText(G,iVar4,iVar8);
      }
      (**(code **)((long)&pyVar6->action + lVar9))
                (G,G->text,iVar4,(long)&pyVar6->begin + lVar9,G->data);
      lVar9 = lVar9 + 0x20;
    }
    G->thunkpos = 0;
  }
  iVar4 = G->pos;
  iVar8 = G->limit - iVar4;
  G->limit = iVar8;
  if (iVar8 != 0) {
    memmove(G->buf,G->buf + iVar4,(long)iVar8);
    iVar4 = G->pos;
  }
  G->offset = G->offset + iVar4;
  uVar1 = G->begin;
  uVar2 = G->end;
  G->begin = uVar1 - iVar4;
  G->end = uVar2 - iVar4;
  G->thunkpos = 0;
  G->pos = 0;
  return iVar3;
}

Assistant:

YY_PARSE(int) YY_NAME(parse_from)(GREG *G, yyrule yystart)
{
  int yyok;
  if (!G->buflen)
    {
      G->buflen= YY_BUFFER_START_SIZE;
      G->buf= (char*)YY_ALLOC(G->buflen, G->data);
      G->textlen= YY_BUFFER_START_SIZE;
      G->text= (char*)YY_ALLOC(G->textlen, G->data);
      G->thunkslen= YY_STACK_SIZE;
      G->thunks= (yythunk*)YY_ALLOC(sizeof(yythunk) * G->thunkslen, G->data);
      G->valslen= YY_STACK_SIZE;
      G->vals= (YYSTYPE*)YY_ALLOC(sizeof(YYSTYPE) * G->valslen, G->data);
      G->begin= G->end= G->pos= G->limit= G->thunkpos= 0;
    }
  G->pos = 0;
  G->begin= G->end= G->pos;
  G->thunkpos= 0;
  G->val= G->vals;
  yyok= yystart(G);
  if (yyok) yyDone(G);
  yyCommit(G);
  return yyok;
  (void)yyrefill;
  (void)yymatchDot;
  (void)yymatchChar;
  (void)yymatchString;
  (void)yymatchClass;
  (void)yyDo;
  (void)yyText;
  (void)yyDone;
  (void)yyCommit;
  (void)yyAccept;
  (void)yyPush;
  (void)yyPop;
  (void)yySet;
}